

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O0

ssize_t memory_write(archive *a,void *client_data,void *buff,size_t length)

{
  size_t in_RCX;
  void *in_RDX;
  long *in_RSI;
  archive *in_RDI;
  write_memory_data *mine;
  size_t local_8;
  
  if ((ulong)in_RSI[1] < *in_RSI + in_RCX) {
    archive_set_error(in_RDI,0xc,"Buffer exhausted");
    local_8 = 0xffffffffffffffe2;
  }
  else {
    memcpy((void *)(in_RSI[3] + *in_RSI),in_RDX,in_RCX);
    *in_RSI = in_RCX + *in_RSI;
    local_8 = in_RCX;
    if (in_RSI[2] != 0) {
      *(long *)in_RSI[2] = *in_RSI;
    }
  }
  return local_8;
}

Assistant:

static ssize_t
memory_write(struct archive *a, void *_private, const void *buff, size_t size)
{
	struct fileblocks *private = _private;
	struct fileblock *block;

	(void)a;

	if ((const char *)nulldata <= (const char *)buff
	    && (const char *)buff < (const char *)nulldata + nullsize) {
		/* We don't need to store a block of gap data. */
		private->last->gap_size += (int64_t)size;
	} else {
		/* Yes, we're assuming the very first write is metadata. */
		/* It's header or metadata, copy and save it. */
		block = (struct fileblock *)malloc(sizeof(*block));
		memset(block, 0, sizeof(*block));
		block->size = size;
		block->buff = malloc(size);
		memcpy(block->buff, buff, size);
		if (private->last == NULL) {
			private->first = private->last = block;
		} else {
			private->last->next = block;
			private->last = block;
		}
		block->next = NULL;
	}
	private->filesize += size;
	return ((long)size);
}